

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall pbrt::ProjectiveCamera::InitMetadata(ProjectiveCamera *this,ImageMetadata *metadata)

{
  Vector3f delta;
  Transform NDCFromWorld;
  float in_stack_fffffffffffffc38;
  float in_stack_fffffffffffffc3c;
  Transform *this_00;
  ImageMetadata *in_stack_fffffffffffffcb8;
  CameraBase *in_stack_fffffffffffffcc0;
  Transform *in_stack_fffffffffffffcc8;
  Transform *in_stack_fffffffffffffcd0;
  SquareMatrix<4> *in_stack_fffffffffffffce8;
  Transform *in_stack_fffffffffffffcf0;
  Float in_stack_fffffffffffffd0c;
  Float in_stack_fffffffffffffd10;
  Float in_stack_fffffffffffffd14;
  Float in_stack_fffffffffffffd4c;
  CameraTransform *in_stack_fffffffffffffd50;
  Transform local_110;
  Transform local_90;
  
  this_00 = &local_90;
  CameraTransform::CameraFromWorld(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
  Transform::GetMatrix(this_00);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=
            ((optional<pbrt::SquareMatrix<4>_> *)this_00,
             (SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  Vector3<float>::Vector3
            ((Vector3<float> *)this_00,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,0.0);
  delta.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffd10;
  delta.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffd0c;
  delta.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffd14;
  Translate(delta);
  Scale(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
  Transform::operator*(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  Transform::operator*(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator*((optional<pbrt::SquareMatrix<4>_> *)0x84dcf2);
  Transform::Transform(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  Transform::operator*(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  Transform::GetMatrix(&local_110);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=
            ((optional<pbrt::SquareMatrix<4>_> *)this_00,
             (SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  CameraBase::InitMetadata(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  return;
}

Assistant:

void ProjectiveCamera::InitMetadata(ImageMetadata *metadata) const {
    metadata->cameraFromWorld = cameraTransform.CameraFromWorld(shutterOpen).GetMatrix();

    // TODO: double check this
    Transform NDCFromWorld = Translate(Vector3f(0.5, 0.5, 0.5)) * Scale(0.5, 0.5, 0.5) *
                             screenFromCamera * *metadata->cameraFromWorld;
    metadata->NDCFromWorld = NDCFromWorld.GetMatrix();

    CameraBase::InitMetadata(metadata);
}